

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cached-powers.cc
# Opt level: O2

void FIX::double_conversion::PowersOfTenCache::GetCachedPowerForBinaryExponentRange
               (int min_exponent,int max_exponent,DiyFp *power,int *decimal_exponent)

{
  uint64_t uVar1;
  uint uVar2;
  long lVar3;
  int iVar4;
  double dVar5;
  
  dVar5 = ceil((double)(min_exponent + 0x3f) * 0.30102999566398114);
  if (0x2be < (int)dVar5 + 0x16aU) {
    __assert_fail("0 <= index && index < kCachedPowersLength",
                  "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/cached-powers.cc"
                  ,0x98,
                  "static void FIX::double_conversion::PowersOfTenCache::GetCachedPowerForBinaryExponentRange(int, int, DiyFp *, int *)"
                 );
  }
  uVar2 = (int)dVar5 + 0x15b;
  lVar3 = (ulong)(ushort)((short)((int)((uint)(ushort)((short)uVar2 >> 0xf) << 0x10 | uVar2 & 0xffff
                                       ) / 8) + 1) * 0x10;
  iVar4 = (int)*(short *)(kCachedPowers + lVar3 + 8);
  if (min_exponent <= iVar4) {
    if (iVar4 <= max_exponent) {
      uVar1 = *(uint64_t *)(kCachedPowers + lVar3);
      *decimal_exponent = (int)*(short *)(kCachedPowers + lVar3 + 10);
      power->f_ = uVar1;
      power->e_ = iVar4;
      return;
    }
    __assert_fail("cached_power.binary_exponent <= max_exponent",
                  "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/cached-powers.cc"
                  ,0x9c,
                  "static void FIX::double_conversion::PowersOfTenCache::GetCachedPowerForBinaryExponentRange(int, int, DiyFp *, int *)"
                 );
  }
  __assert_fail("min_exponent <= cached_power.binary_exponent",
                "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/cached-powers.cc"
                ,0x9a,
                "static void FIX::double_conversion::PowersOfTenCache::GetCachedPowerForBinaryExponentRange(int, int, DiyFp *, int *)"
               );
}

Assistant:

void PowersOfTenCache::GetCachedPowerForBinaryExponentRange(
    int min_exponent,
    int max_exponent,
    DiyFp* power,
    int* decimal_exponent) {
  int kQ = DiyFp::kSignificandSize;
  double k = ceil((min_exponent + kQ - 1) * kD_1_LOG2_10);
  int foo = kCachedPowersOffset;
  int index =
      (foo + static_cast<int>(k) - 1) / kDecimalExponentDistance + 1;
  ASSERT(0 <= index && index < kCachedPowersLength);
  CachedPower cached_power = kCachedPowers[index];
  ASSERT(min_exponent <= cached_power.binary_exponent);
  (void) max_exponent;  // Mark variable as used.
  ASSERT(cached_power.binary_exponent <= max_exponent);
  *decimal_exponent = cached_power.decimal_exponent;
  *power = DiyFp(cached_power.significand, cached_power.binary_exponent);
}